

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.cpp
# Opt level: O1

bool __thiscall ser::DataFieldInfo::operator==(DataFieldInfo *this,DataFieldInfo *other)

{
  __type _Var1;
  bool bVar2;
  
  if (((((this->bytesPerElement_ == other->bytesPerElement_) && (this->rank_ == other->rank_)) &&
       (this->iSize_ == other->iSize_)) &&
      ((((this->jSize_ == other->jSize_ && (this->kSize_ == other->kSize_)) &&
        ((this->lSize_ == other->lSize_ &&
         ((this->iMinusHalo_ == other->iMinusHalo_ && (this->iPlusHalo_ == other->iPlusHalo_))))))
       && (this->jMinusHalo_ == other->jMinusHalo_)))) &&
     ((((this->jPlusHalo_ == other->jPlusHalo_ && (this->kMinusHalo_ == other->kMinusHalo_)) &&
       (this->kPlusHalo_ == other->kPlusHalo_)) &&
      ((this->lMinusHalo_ == other->lMinusHalo_ && (this->lPlusHalo_ == other->lPlusHalo_)))))) {
    _Var1 = std::operator==(&this->name_,&other->name_);
    if (_Var1) {
      _Var1 = std::operator==(&this->type_,&other->type_);
      if (_Var1) {
        bVar2 = MetainfoSet::operator==(&this->metainfo_,&other->metainfo_);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool DataFieldInfo::operator==(const DataFieldInfo& other) const
{
    // Compare the least expensive elements first
    return (
            bytesPerElement_ == other.bytesPerElement_ &&
            rank_ == other.rank_ &&

            iSize_ == other.iSize_ &&
            jSize_ == other.jSize_ &&
            kSize_ == other.kSize_ &&
            lSize_ == other.lSize_ &&

            iMinusHalo_ == other.iMinusHalo_ &&
            iPlusHalo_  == other.iPlusHalo_ &&
            jMinusHalo_ == other.jMinusHalo_ &&
            jPlusHalo_  == other.jPlusHalo_ &&
            kMinusHalo_ == other.kMinusHalo_ &&
            kPlusHalo_  == other.kPlusHalo_ &&
            lMinusHalo_ == other.lMinusHalo_ &&
            lPlusHalo_  == other.lPlusHalo_ &&

            name_ == other.name_ &&
            type_ == other.type_ &&
            metainfo_ == other.metainfo_
        );
}